

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFx.c
# Opt level: O0

void Gia_ManFxTopoOrder_rec
               (Vec_Wec_t *vCubes,Vec_Int_t *vFirst,Vec_Int_t *vCount,Vec_Int_t *vVisit,
               Vec_Int_t *vOrder,int iObj)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *p;
  Vec_Int_t *vCube;
  int nCubes;
  int iFirst;
  int Lit;
  int v;
  int c;
  int iObj_local;
  Vec_Int_t *vOrder_local;
  Vec_Int_t *vVisit_local;
  Vec_Int_t *vCount_local;
  Vec_Int_t *vFirst_local;
  Vec_Wec_t *vCubes_local;
  
  iVar1 = Vec_IntEntry(vFirst,iObj);
  iVar2 = Vec_IntEntry(vCount,iObj);
  iVar3 = Vec_IntEntry(vVisit,iObj);
  if (iVar3 != 0) {
    __assert_fail("!Vec_IntEntry( vVisit, iObj )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaFx.c"
                  ,0x106,
                  "void Gia_ManFxTopoOrder_rec(Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                 );
  }
  Vec_IntWriteEntry(vVisit,iObj,1);
  Lit = 0;
  while( true ) {
    if (iVar2 <= Lit) {
      Vec_IntPush(vOrder,iObj);
      return;
    }
    p = Vec_WecEntry(vCubes,iVar1 + Lit);
    iVar3 = Vec_IntEntry(p,0);
    if (iVar3 != iObj) break;
    for (iFirst = 1; iVar3 = Vec_IntSize(p), iFirst < iVar3; iFirst = iFirst + 1) {
      iVar3 = Vec_IntEntry(p,iFirst);
      iVar4 = Abc_Lit2Var(iVar3);
      iVar4 = Vec_IntEntry(vVisit,iVar4);
      if (iVar4 == 0) {
        iVar3 = Abc_Lit2Var(iVar3);
        Gia_ManFxTopoOrder_rec(vCubes,vFirst,vCount,vVisit,vOrder,iVar3);
      }
    }
    Lit = Lit + 1;
  }
  __assert_fail("Vec_IntEntry(vCube, 0) == iObj",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaFx.c"
                ,0x10b,
                "void Gia_ManFxTopoOrder_rec(Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
               );
}

Assistant:

void Gia_ManFxTopoOrder_rec( Vec_Wec_t * vCubes, Vec_Int_t * vFirst, Vec_Int_t * vCount, Vec_Int_t * vVisit, Vec_Int_t * vOrder, int iObj )
{
    int c, v, Lit;
    int iFirst = Vec_IntEntry( vFirst, iObj );
    int nCubes = Vec_IntEntry( vCount, iObj ); 
    assert( !Vec_IntEntry( vVisit, iObj ) );
    Vec_IntWriteEntry( vVisit, iObj, 1 );
    for ( c = 0; c < nCubes; c++ )
    {
        Vec_Int_t * vCube = Vec_WecEntry( vCubes, iFirst + c );
        assert( Vec_IntEntry(vCube, 0) == iObj );
        Vec_IntForEachEntryStart( vCube, Lit, v, 1 )
            if ( !Vec_IntEntry( vVisit, Abc_Lit2Var(Lit) ) )
                Gia_ManFxTopoOrder_rec( vCubes, vFirst, vCount, vVisit, vOrder, Abc_Lit2Var(Lit) );
    }
    Vec_IntPush( vOrder, iObj );
}